

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<long_long> * __thiscall
TPZVec<long_long>::operator=(TPZVec<long_long> *this,TPZVec<long_long> *copy)

{
  longlong *plVar1;
  longlong *plVar2;
  long lVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    plVar1 = copy->fStore;
    plVar2 = this->fStore;
    lVar4 = 0;
    lVar3 = copy->fNElements;
    if (copy->fNElements < 1) {
      lVar3 = lVar4;
    }
    for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      plVar2[lVar4] = plVar1[lVar4];
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}